

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O3

void byte_array_print(char *s)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  
  putchar(0x5b);
  bVar1 = *s;
  if (bVar1 != 0) {
    pbVar3 = (byte *)(s + 1);
    bVar2 = false;
    do {
      if (bVar2) {
        putchar(0x2c);
        bVar1 = pbVar3[-1];
      }
      printf("0x%02X",(ulong)bVar1);
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
      bVar2 = true;
    } while (bVar1 != 0);
  }
  putchar(0x5d);
  return;
}

Assistant:

static void byte_array_print(char const* s)
{
  unsigned char const* d = reinterpret_cast<unsigned char const*>(s);
  bool started = false;
  printf("[");
  for (; *d; ++d) {
    if (started) {
      printf(",");
    }
    started = true;
    printf("0x%02X", static_cast<int>(*d));
  }
  printf("]");
}